

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Serialize<SizeComputer,CTxUndo,std::allocator<CTxUndo>>
               (SizeComputer *os,vector<CTxUndo,_std::allocator<CTxUndo>_> *v)

{
  long lVar1;
  vector<CTxUndo,_std::allocator<CTxUndo>_> *in_RSI;
  SizeComputer *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Using<VectorFormatter<DefaultFormatter>,std::vector<CTxUndo,std::allocator<CTxUndo>>const&>
            (in_RSI);
  Serialize<SizeComputer,_Wrapper<VectorFormatter<DefaultFormatter>,_const_std::vector<CTxUndo,_std::allocator<CTxUndo>_>_&>_>
            (in_RDI,(Wrapper<VectorFormatter<DefaultFormatter>,_const_std::vector<CTxUndo,_std::allocator<CTxUndo>_>_&>
                     *)0x3ad416);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else if constexpr (std::is_same_v<T, bool>) {
        // A special case for std::vector<bool>, as dereferencing
        // std::vector<bool>::const_iterator does not result in a const bool&
        // due to std::vector's special casing for bool arguments.
        WriteCompactSize(os, v.size());
        for (bool elem : v) {
            ::Serialize(os, elem);
        }
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}